

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec6MoveTo(word t,int v,int p,int *Pla2Var,int *Var2Pla)

{
  int iVar1;
  int v_00;
  int iPlace1;
  int iPlace0;
  int *Var2Pla_local;
  int *Pla2Var_local;
  int p_local;
  int v_local;
  word t_local;
  
  _p_local = t;
  if (Var2Pla[v] < p) {
    __assert_fail("Var2Pla[v] >= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0xf0,"word If_Dec6MoveTo(word, int, int, int *, int *)");
  }
  while (Var2Pla[v] != p) {
    v_00 = Var2Pla[v] + -1;
    iVar1 = Var2Pla[v];
    _p_local = If_Dec6SwapAdjacent(_p_local,v_00);
    Var2Pla[Pla2Var[v_00]] = Var2Pla[Pla2Var[v_00]] + 1;
    Var2Pla[Pla2Var[iVar1]] = Var2Pla[Pla2Var[iVar1]] + -1;
    Pla2Var[v_00] = Pla2Var[iVar1] ^ Pla2Var[v_00];
    Pla2Var[iVar1] = Pla2Var[v_00] ^ Pla2Var[iVar1];
    Pla2Var[v_00] = Pla2Var[iVar1] ^ Pla2Var[v_00];
  }
  if (Pla2Var[p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0xfc,"word If_Dec6MoveTo(word, int, int, int *, int *)");
  }
  return _p_local;
}

Assistant:

static inline word If_Dec6MoveTo( word t, int v, int p, int Pla2Var[6], int Var2Pla[6] )
{
    int iPlace0, iPlace1;
    assert( Var2Pla[v] >= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        t = If_Dec6SwapAdjacent( t, iPlace0 );
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
    }
    assert( Pla2Var[p] == v );
    return t;
}